

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVIMaker.cpp
# Opt level: O1

VideoStream * __thiscall AVIMaker::getVideoStreamByID(AVIMaker *this,uint32_t stream_id)

{
  pointer ppVVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  VideoStream *unaff_RBX;
  ulong uVar5;
  bool bVar6;
  
  ppVVar1 = (this->videoStreams).super__Vector_base<VideoStream_*,_std::allocator<VideoStream_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->videoStreams).
                super__Vector_base<VideoStream_*,_std::allocator<VideoStream_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppVVar1;
  bVar6 = lVar3 != 0;
  if (bVar6) {
    uVar4 = lVar3 >> 3;
    unaff_RBX = *ppVVar1;
    if (unaff_RBX->m_streamID != (ulong)stream_id) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (uVar4 + (uVar4 == 0) == uVar5) break;
        unaff_RBX = ppVVar1[uVar5];
        uVar2 = uVar5 + 1;
      } while (unaff_RBX->m_streamID != (ulong)stream_id);
      bVar6 = uVar5 < uVar4;
    }
  }
  if (!bVar6) {
    if (this->isTrace == true) {
      unaff_RBX = (VideoStream *)0x0;
      printf("getVideoStreamByID failed. id = %d");
    }
    else {
      unaff_RBX = (VideoStream *)0x0;
    }
  }
  return unaff_RBX;
}

Assistant:

VideoStream *AVIMaker::getVideoStreamByID(uint32_t stream_id) {
    for (int i = 0; i < this->videoStreams.size(); i++) {
        if (this->videoStreams[i]->getStreamID() == stream_id) return this->videoStreams[i];
    }
    TRACE printf("getVideoStreamByID failed. id = %d", stream_id);
    return nullptr;
}